

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar1;
  text *ptVar2;
  undefined1 uVar3;
  int iVar4;
  undefined8 uVar5;
  runtime_error *this_01;
  undefined1 uVar6;
  pointer pbVar7;
  _Alloc_hider _Var8;
  undefined1 uVar9;
  bool bVar10;
  undefined4 uVar11;
  text opt;
  text val;
  text arg;
  texts in;
  undefined1 local_220;
  undefined1 local_21c;
  undefined1 local_218;
  undefined1 local_214;
  undefined1 local_210;
  undefined1 local_20c;
  undefined1 local_204;
  seed_t local_200;
  undefined1 local_1fc;
  undefined1 local_1f8 [48];
  undefined4 local_1c8;
  int local_1c4;
  ulong local_1c0;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  _Alloc_hider local_178;
  char local_168 [16];
  value_type local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_120;
  text local_118;
  text local_f8;
  text local_d8;
  text local_b8;
  text local_98;
  runtime_error local_78 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar7 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_220 = 0;
    uVar3 = 0;
    local_204 = 0;
    uVar9 = 0;
    local_1fc = 0;
    local_200 = 0;
    local_218 = 0;
    local_21c = 0;
    local_214 = 0;
    local_210 = 0;
    local_20c = 0;
    iVar4 = 1;
    uVar11 = 0;
    uVar6 = 0;
  }
  else {
    local_1c4 = 1;
    bVar10 = true;
    local_20c = 0;
    local_210 = 0;
    local_214 = 0;
    local_21c = 0;
    local_218 = 0;
    local_200 = 0;
    local_1fc = 0;
    uVar9 = 0;
    local_1c8 = 0;
    local_204 = 0;
    uVar3 = 0;
    local_1c0 = 0;
    local_220 = 0;
    local_120 = __return_storage_ptr__;
    do {
      local_1f8._0_8_ = local_1f8 + 0x10;
      local_1f8._8_8_ = 0;
      local_1f8._16_4_ = local_1f8._16_4_ & 0xffffff00;
      local_1b8 = local_1a8;
      local_1b0 = 0;
      local_1a8[0] = 0;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      pcVar1 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,pcVar1,pcVar1 + pbVar7->_M_string_length);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      split_option((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_198,&local_98);
      std::__cxx11::string::_M_assign((string *)local_1f8);
      std::__cxx11::string::_M_assign((string *)&local_1b8);
      if (local_178._M_p != local_168) {
        operator_delete(local_178._M_p);
      }
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((bVar10) && (*(char *)local_1f8._0_8_ == '-')) {
        iVar4 = std::__cxx11::string::compare(local_1f8);
        if (iVar4 == 0) goto LAB_0010a56e;
        iVar4 = std::__cxx11::string::compare(local_1f8);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_1f8), iVar4 == 0)) {
          local_20c = 1;
LAB_0010a5f7:
          bVar10 = true;
        }
        else {
          iVar4 = std::__cxx11::string::compare(local_1f8);
          if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_1f8), iVar4 == 0)) {
            local_210 = 1;
            goto LAB_0010a5f7;
          }
          iVar4 = std::__cxx11::string::compare(local_1f8);
          if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_1f8), iVar4 == 0)) {
            local_214 = 1;
            goto LAB_0010a5f7;
          }
          iVar4 = std::__cxx11::string::compare(local_1f8);
          if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_1f8), iVar4 == 0)) {
            local_218 = 1;
            goto LAB_0010a5f7;
          }
          iVar4 = std::__cxx11::string::compare(local_1f8);
          if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_1f8), iVar4 == 0)) {
            local_21c = 1;
            goto LAB_0010a5f7;
          }
          iVar4 = std::__cxx11::string::compare(local_1f8);
          if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_1f8), iVar4 == 0)) {
            local_220 = 1;
            goto LAB_0010a5f7;
          }
          uVar5 = std::__cxx11::string::compare(local_1f8);
          bVar10 = true;
          if (((int)uVar5 == 0) ||
             (uVar5 = std::__cxx11::string::compare(local_1f8), (int)uVar5 == 0)) {
            local_1c0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_0010a571;
          }
          iVar4 = std::__cxx11::string::compare(local_1f8);
          if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_1f8), iVar4 == 0)) {
            uVar3 = 1;
            goto LAB_0010a5f7;
          }
          iVar4 = std::__cxx11::string::compare(local_1f8);
          if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_1f8), iVar4 == 0)) {
            uVar9 = 1;
            goto LAB_0010a5f7;
          }
          iVar4 = std::__cxx11::string::compare(local_1f8);
          bVar10 = true;
          if (iVar4 == 0) {
            local_1fc = 1;
          }
          else {
            iVar4 = std::__cxx11::string::compare(local_1f8);
            if ((iVar4 != 0) ||
               (iVar4 = std::__cxx11::string::compare((char *)&local_1b8), iVar4 != 0)) {
              iVar4 = std::__cxx11::string::compare(local_1f8);
              if ((iVar4 == 0) &&
                 (iVar4 = std::__cxx11::string::compare((char *)&local_1b8), iVar4 == 0)) {
                local_204 = 1;
              }
              else {
                iVar4 = std::__cxx11::string::compare(local_1f8);
                if ((iVar4 != 0) ||
                   (uVar5 = std::__cxx11::string::compare((char *)&local_1b8), (int)uVar5 != 0)) {
                  iVar4 = std::__cxx11::string::compare(local_1f8);
                  if (iVar4 == 0) {
                    local_198._0_8_ = local_198 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_198,"--random-seed","");
                    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_b8,local_198._0_8_,
                               (pointer)(local_198._0_8_ +
                                        CONCAT44(local_198._12_4_,
                                                 CONCAT13(local_198[0xb],
                                                          CONCAT12(local_198[10],
                                                                   CONCAT11(local_198[9],
                                                                            local_198[8]))))));
                    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_d8,local_1b8,local_1b8 + local_1b0);
                    local_200 = seed(&local_b8,&local_d8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                      operator_delete(local_d8._M_dataplus._M_p);
                    }
                    ptVar2 = &local_b8;
                    _Var8._M_p = local_b8._M_dataplus._M_p;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare(local_1f8);
                    if (iVar4 != 0) {
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(&local_50,"unrecognised option \'",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1f8);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_198,&local_50,"\' (try option --help)");
                      std::runtime_error::runtime_error(local_78,(string *)local_198);
                      std::runtime_error::runtime_error(this_01,local_78);
                      __cxa_throw(this_01,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_198._0_8_ = local_198 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_198,"--repeat","");
                    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_f8,local_198._0_8_,
                               (pointer)(local_198._0_8_ +
                                        CONCAT44(local_198._12_4_,
                                                 CONCAT13(local_198[0xb],
                                                          CONCAT12(local_198[10],
                                                                   CONCAT11(local_198[9],
                                                                            local_198[8]))))));
                    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_118,local_1b8,local_1b8 + local_1b0);
                    local_1c4 = repeat(&local_f8,&local_118);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p);
                    }
                    ptVar2 = &local_f8;
                    _Var8._M_p = local_f8._M_dataplus._M_p;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var8._M_p != &ptVar2->field_2) {
                    operator_delete(_Var8._M_p);
                  }
                  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
                    operator_delete((void *)local_198._0_8_);
                  }
                  goto LAB_0010a571;
                }
                local_1c8 = (undefined4)CONCAT71((int7)((ulong)uVar5 >> 8),1);
              }
              goto LAB_0010a5f7;
            }
          }
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_138,&local_158);
LAB_0010a56e:
        bVar10 = false;
      }
LAB_0010a571:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8);
      }
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
        operator_delete((void *)local_1f8._0_8_);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    __return_storage_ptr__ = local_120;
    iVar4 = local_1c4;
    uVar11 = local_1c8;
    uVar6 = 1;
    if ((local_1c0 & 1) == 0) {
      uVar6 = uVar3;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,&local_138);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_198 + 0x18);
  local_198[1] = local_210;
  local_198[0] = local_20c;
  local_198[2] = local_214;
  local_198[3] = local_21c;
  local_198[4] = local_218;
  local_198[5] = local_220;
  local_198[6] = uVar6;
  local_198[7] = uVar3;
  local_198[8] = local_204;
  local_198[9] = (undefined1)uVar11;
  local_198[0xb] = local_1fc;
  local_198._16_4_ = local_200;
  local_198[10] = uVar9;
  local_198._12_4_ = iVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00,&local_68);
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(local_1f8 + 0x18);
  local_1f8._16_4_ = local_198._16_4_;
  local_1f8._8_8_ =
       CONCAT44(local_198._12_4_,
                CONCAT13(local_198[0xb],CONCAT12(local_198[10],CONCAT11(local_198[9],local_198[8])))
               );
  local_1f8._0_8_ = local_198._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this,this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  (__return_storage_ptr__->first).seed = local_1f8._16_4_;
  (__return_storage_ptr__->first).help = (bool)local_1f8[0];
  (__return_storage_ptr__->first).abort = (bool)local_1f8[1];
  (__return_storage_ptr__->first).count = (bool)local_1f8[2];
  (__return_storage_ptr__->first).list = (bool)local_1f8[3];
  (__return_storage_ptr__->first).tags = (bool)local_1f8[4];
  (__return_storage_ptr__->first).time = (bool)local_1f8[5];
  (__return_storage_ptr__->first).pass = (bool)local_1f8[6];
  (__return_storage_ptr__->first).zen = (bool)local_1f8[7];
  (__return_storage_ptr__->first).lexical = (bool)local_1f8[8];
  (__return_storage_ptr__->first).random = (bool)local_1f8[9];
  (__return_storage_ptr__->first).verbose = (bool)local_1f8[10];
  (__return_storage_ptr__->first).version = (bool)local_1f8[0xb];
  (__return_storage_ptr__->first).repeat = local_1f8._12_4_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->second,this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}